

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O2

string * __thiscall
jbcoin::STInteger<unsigned_char>::getText_abi_cxx11_
          (string *__return_storage_ptr__,STInteger<unsigned_char> *this)

{
  bool bVar1;
  int iVar2;
  uchar in_DL;
  uchar extraout_DL;
  string token;
  Stream local_1a8;
  ScopedStream local_198;
  
  if (((this->super_STBase).fName)->fieldCode == sfTransactionResult) {
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar1 = transResultInfo((uint)this->value_,&token,__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&token);
      return __return_storage_ptr__;
    }
    debugLog();
    iVar2 = (*(local_198.m_sink)->_vptr_Sink[2])(local_198.m_sink,4);
    if ((char)iVar2 != '\0') {
      debugLog();
      local_1a8.m_level = kError;
      beast::Journal::ScopedStream::ScopedStream<char[34]>
                (&local_198,&local_1a8,(char (*) [34])"Unknown result code in metadata: ");
      beast::Journal::ScopedStream::operator<<(&local_198,&this->value_);
      beast::Journal::ScopedStream::~ScopedStream(&local_198);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&token);
    in_DL = extraout_DL;
  }
  beast::lexicalCastThrow<std::__cxx11::string,unsigned_char>
            (__return_storage_ptr__,(beast *)(ulong)this->value_,in_DL);
  return __return_storage_ptr__;
}

Assistant:

std::string
STUInt8::getText () const
{
    if (getFName () == sfTransactionResult)
    {
        std::string token, human;

        if (transResultInfo (static_cast<TER> (value_), token, human))
            return human;

        JLOG (debugLog().error())
            << "Unknown result code in metadata: " << value_;
    }

    return beast::lexicalCastThrow <std::string> (value_);
}